

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleVertexArrayNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  _Alloc_hider __s2;
  int iVar1;
  Property *prop;
  DataArrayList *vaList;
  DeadlyImportError *this_00;
  string local_90;
  string propKey;
  string propName;
  
  if (node == (DDLNode *)0x0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"No parent node for name.",(allocator<char> *)&propName);
    DeadlyImportError::DeadlyImportError(this_00,&local_90);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prop = ODDLParser::DDLNode::getProperties(node);
  if (prop == (Property *)0x0) {
    return;
  }
  propName._M_dataplus._M_p = (pointer)&propName.field_2;
  propName._M_string_length = 0;
  propName.field_2._M_local_buf[0] = '\0';
  propKey._M_dataplus._M_p = (pointer)&propKey.field_2;
  propKey._M_string_length = 0;
  propKey.field_2._M_local_buf[0] = '\0';
  propId2StdString(prop,&propName,&propKey);
  __s2._M_p = propKey._M_dataplus._M_p;
  if (propKey._M_dataplus._M_p == (pointer)0x0) {
    __assert_fail("nullptr != attribName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x2ee,"MeshAttribute Assimp::OpenGEX::getAttributeByName(const char *)");
  }
  iVar1 = strncmp(PosToken_abi_cxx11_,propKey._M_dataplus._M_p,DAT_008316a8);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = strncmp(ColToken_abi_cxx11_,__s2._M_p,DAT_008316c8);
    if (iVar1 == 0) {
      iVar1 = 2;
    }
    else {
      iVar1 = strncmp(NormalToken_abi_cxx11_,__s2._M_p,DAT_008316e8);
      if (iVar1 == 0) {
        iVar1 = 3;
      }
      else {
        iVar1 = strncmp(TexCoordToken_abi_cxx11_,__s2._M_p,DAT_00831708);
        if (iVar1 != 0) goto LAB_00468998;
        iVar1 = 4;
      }
    }
  }
  vaList = ODDLParser::DDLNode::getDataArrayList(node);
  if (vaList != (DataArrayList *)0x0) {
    countDataArrayListItems(vaList);
    (*(code *)(&DAT_005df400 + *(int *)(&DAT_005df400 + (ulong)(iVar1 - 1) * 4)))();
    return;
  }
LAB_00468998:
  std::__cxx11::string::~string((string *)&propKey);
  std::__cxx11::string::~string((string *)&propName);
  return;
}

Assistant:

void OpenGEXImporter::handleVertexArrayNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    Property *prop( node->getProperties() );
    if( nullptr != prop ) {
        std::string propName, propKey;
        propId2StdString( prop, propName, propKey );
        MeshAttribute attribType( getAttributeByName( propKey.c_str() ) );
        if( None == attribType ) {
            return;
        }

        DataArrayList *vaList = node->getDataArrayList();
        if( nullptr == vaList ) {
            return;
        }

        const size_t numItems( countDataArrayListItems( vaList ) );

        if( Position == attribType ) {
            m_currentVertices.m_vertices.resize( numItems );
            copyVectorArray( numItems, vaList, m_currentVertices.m_vertices.data() );
        } else if ( Color == attribType ) {
            m_currentVertices.m_numColors = numItems;
            m_currentVertices.m_colors = new aiColor4D[ numItems ];
            copyColor4DArray( numItems, vaList, m_currentVertices.m_colors );
        } else if( Normal == attribType ) {
            m_currentVertices.m_normals.resize( numItems );
            copyVectorArray( numItems, vaList, m_currentVertices.m_normals.data() );
        } else if( TexCoord == attribType ) {
            m_currentVertices.m_numUVComps[ 0 ] = numItems;
            m_currentVertices.m_textureCoords[ 0 ] = new aiVector3D[ numItems ];
            copyVectorArray( numItems, vaList, m_currentVertices.m_textureCoords[ 0 ] );
        }
    }
}